

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierBuilder::AddL(CQualifierBuilder *this)

{
  _Base_bitset<2UL> local_50;
  _Base_bitset<2UL> local_40;
  _Base_bitset<2UL> local_30;
  _Base_bitset<2UL> local_20;
  CQualifierBuilder *local_10;
  CQualifierBuilder *this_local;
  
  local_10 = this;
  if ((this->negative & 1U) == 0) {
    local_50._M_w = (_WordT  [2])std::bitset<128UL>::operator~(&this->ansicharsFixed);
    local_40._M_w = (_WordT  [2])std::operator&((bitset<128UL> *)AnsiL,(bitset<128UL> *)&local_50);
    std::bitset<128UL>::operator|=(&this->ansichars,(bitset<128UL> *)&local_40);
  }
  else {
    local_30._M_w = (_WordT  [2])std::bitset<128UL>::operator~((bitset<128UL> *)AnsiL);
    local_20._M_w = (_WordT  [2])std::operator|((bitset<128UL> *)&local_30,&this->ansicharsFixed);
    std::bitset<128UL>::operator&=(&this->ansichars,(bitset<128UL> *)&local_20);
  }
  std::bitset<128UL>::operator|=(&this->ansicharsFixed,(bitset<128UL> *)AnsiL);
  return;
}

Assistant:

void CQualifierBuilder::AddL()
{
	if( negative ) {
		ansichars &= ~AnsiL | ansicharsFixed;
	} else {
		ansichars |= AnsiL & ~ansicharsFixed;
	}
	ansicharsFixed |= AnsiL;
}